

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O0

Regexp * __thiscall re2::Regexp::Simplify(Regexp *this)

{
  Regexp *re;
  Regexp *sre;
  SimplifyWalker sw;
  Regexp *cre;
  CoalesceWalker cw;
  Regexp *this_local;
  
  cw.super_Walker<re2::Regexp_*>._16_8_ = this;
  CoalesceWalker::CoalesceWalker((CoalesceWalker *)&cre);
  re = Walker<re2::Regexp_*>::Walk((Walker<re2::Regexp_*> *)&cre,this,(Regexp *)0x0);
  if (re == (Regexp *)0x0) {
    sw.super_Walker<re2::Regexp_*>.stopped_early_ = true;
    sw.super_Walker<re2::Regexp_*>._17_3_ = 0;
    this_local = (Regexp *)0x0;
  }
  else {
    SimplifyWalker::SimplifyWalker((SimplifyWalker *)&sre);
    this_local = Walker<re2::Regexp_*>::Walk((Walker<re2::Regexp_*> *)&sre,re,(Regexp *)0x0);
    Decref(re);
    sw.super_Walker<re2::Regexp_*>.stopped_early_ = true;
    sw.super_Walker<re2::Regexp_*>._17_3_ = 0;
    SimplifyWalker::~SimplifyWalker((SimplifyWalker *)&sre);
  }
  CoalesceWalker::~CoalesceWalker((CoalesceWalker *)&cre);
  return this_local;
}

Assistant:

Regexp* Regexp::Simplify() {
  CoalesceWalker cw;
  Regexp* cre = cw.Walk(this, NULL);
  if (cre == NULL)
    return cre;
  SimplifyWalker sw;
  Regexp* sre = sw.Walk(cre, NULL);
  cre->Decref();
  return sre;
}